

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanObjectWrappers.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
Release(VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6> *this)

{
  bool bVar1;
  element_type *this_00;
  VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6> *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if ((bVar1) && (this->m_VkObject != (VkDeviceMemory_T *)0x0)) {
    this_00 = std::
              __shared_ptr_access<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    VulkanLogicalDevice::ReleaseVulkanObject(this_00,this);
  }
  this->m_VkObject = (VkDeviceMemory_T *)0x0;
  std::__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> *
             )this);
  return;
}

Assistant:

void Release()
    {
        // For externally managed objects, m_pLogicalDevice is null
        if (m_pLogicalDevice && m_VkObject != VK_NULL_HANDLE)
        {
            m_pLogicalDevice->ReleaseVulkanObject(std::move(*this));
        }
        m_VkObject = VK_NULL_HANDLE;
        m_pLogicalDevice.reset();
    }